

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::AddOutPt(Clipper *this,TEdge *e,IntPoint *pt)

{
  EdgeSide EVar1;
  int iVar2;
  EdgeSide EVar3;
  OutRec *pOVar4;
  long lVar5;
  OutPt *pOVar6;
  long64 lVar7;
  OutPt *pOVar8;
  OutPt *pOVar9;
  EdgeSide EVar10;
  long lVar11;
  long lVar12;
  OutRec *outRec;
  
  if ((long)e->outIdx < 0) {
    outRec = CreateOutRec(this);
    std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::push_back
              (&this->m_PolyOuts,&outRec);
    pOVar4 = outRec;
    outRec->idx = (int)((ulong)((long)(this->m_PolyOuts).
                                      super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_PolyOuts).
                                     super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    iVar2 = outRec->idx;
    e->outIdx = iVar2;
    pOVar8 = (OutPt *)operator_new(0x28);
    pOVar4->pts = pOVar8;
    pOVar4->bottomPt = pOVar8;
    lVar7 = pt->Y;
    (pOVar8->pt).X = pt->X;
    (pOVar8->pt).Y = lVar7;
    pOVar8->idx = iVar2;
    pOVar8->next = pOVar8;
    pOVar8->prev = pOVar8;
    SetHoleState(this,e,pOVar4);
    return;
  }
  EVar1 = e->side;
  pOVar4 = (this->m_PolyOuts).
           super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
           super__Vector_impl_data._M_start[e->outIdx];
  pOVar8 = pOVar4->pts;
  if (EVar1 == esLeft) {
    lVar11 = pt->X;
    lVar12 = pt->Y;
    if ((lVar11 == (pOVar8->pt).X) && (lVar12 == (pOVar8->pt).Y)) {
      return;
    }
  }
  else {
    lVar11 = pt->X;
    lVar12 = pt->Y;
    if ((lVar11 == (pOVar8->prev->pt).X) && (lVar12 == (pOVar8->prev->pt).Y)) {
      return;
    }
  }
  EVar3 = pOVar4->sides;
  EVar10 = EVar3 | EVar1;
  if (EVar10 == EVar3) goto LAB_005cc6d5;
  if ((EVar3 == esNeither) && (lVar12 == (pOVar8->pt).Y)) {
    lVar12 = (pOVar8->pt).X;
    if (EVar1 == esLeft) {
      if (lVar11 == lVar12 + 1) {
        return;
      }
      pOVar4->sides = EVar10;
      if (EVar10 != esBoth) goto LAB_005cc6d5;
      goto LAB_005cc63b;
    }
    if (lVar11 == lVar12 + -1) {
      return;
    }
    pOVar4->sides = EVar10;
    if (EVar10 != esBoth) goto LAB_005cc6d5;
LAB_005cc693:
    pOVar9 = pOVar8->prev;
    lVar11 = (pOVar9->pt).Y;
    lVar12 = lVar11 - (pOVar9->prev->pt).Y;
    if (((lVar12 == 0) || (lVar11 = lVar11 - pt->Y, lVar11 == 0)) ||
       (lVar5 = (pOVar9->pt).X, (lVar5 - pt->X) / lVar11 <= (lVar5 - (pOVar9->prev->pt).X) / lVar12)
       ) goto LAB_005cc6d5;
  }
  else {
    pOVar4->sides = EVar10;
    if (EVar10 != esBoth) goto LAB_005cc6d5;
    if (EVar1 != esLeft) goto LAB_005cc693;
LAB_005cc63b:
    lVar11 = (pOVar8->pt).Y;
    lVar12 = lVar11 - (pOVar8->next->pt).Y;
    if (((lVar12 == 0) || (lVar11 = lVar11 - pt->Y, lVar11 == 0)) ||
       (lVar5 = (pOVar8->pt).X, pOVar9 = pOVar8,
       (lVar5 - (pOVar8->next->pt).X) / lVar12 <= (lVar5 - pt->X) / lVar11)) goto LAB_005cc6d5;
  }
  pOVar4->bottomFlag = pOVar9;
LAB_005cc6d5:
  pOVar9 = (OutPt *)operator_new(0x28);
  lVar7 = pt->Y;
  (pOVar9->pt).X = pt->X;
  (pOVar9->pt).Y = lVar7;
  pOVar9->idx = pOVar4->idx;
  if (((pOVar9->pt).Y == (pOVar4->bottomPt->pt).Y) && ((pOVar9->pt).X < (pOVar4->bottomPt->pt).X)) {
    pOVar4->bottomPt = pOVar9;
  }
  pOVar9->next = pOVar8;
  pOVar6 = pOVar8->prev;
  pOVar9->prev = pOVar6;
  pOVar6->next = pOVar9;
  pOVar8->prev = pOVar9;
  if (EVar1 == esLeft) {
    pOVar4->pts = pOVar9;
  }
  return;
}

Assistant:

void Clipper::AddOutPt(TEdge *e, const IntPoint &pt)
{
  bool ToFront = (e->side == esLeft);
  if(  e->outIdx < 0 )
  {
    OutRec *outRec = CreateOutRec();
    m_PolyOuts.push_back(outRec);
    outRec->idx = (int)m_PolyOuts.size()-1;
    e->outIdx = outRec->idx;
    OutPt* op = new OutPt;
    outRec->pts = op;
    outRec->bottomPt = op;
    op->pt = pt;
    op->idx = outRec->idx;
    op->next = op;
    op->prev = op;
    SetHoleState(e, outRec);
  } else
  {
    OutRec *outRec = m_PolyOuts[e->outIdx];
    OutPt* op = outRec->pts;
    if ((ToFront && PointsEqual(pt, op->pt)) ||
      (!ToFront && PointsEqual(pt, op->prev->pt))) return;

    if ((e->side | outRec->sides) != outRec->sides)
    {
      //check for 'rounding' artefacts ...
      if (outRec->sides == esNeither && pt.Y == op->pt.Y)
      {
        if (ToFront)
        {
          if (pt.X == op->pt.X +1) return;    //ie wrong side of bottomPt
        }
        else if (pt.X == op->pt.X -1) return; //ie wrong side of bottomPt
      }

      outRec->sides = (EdgeSide)(outRec->sides | e->side);
      if (outRec->sides == esBoth)
      {
        //A vertex from each side has now been added.
        //Vertices of one side of an output polygon are quite commonly close to
        //or even 'touching' edges of the other side of the output polygon.
        //Very occasionally vertices from one side can 'cross' an edge on the
        //the other side. The distance 'crossed' is always less that a unit
        //and is purely an artefact of coordinate rounding. Nevertheless, this
        //results in very tiny self-intersections. Because of the way
        //orientation is calculated, even tiny self-intersections can cause
        //the Orientation function to return the wrong result. Therefore, it's
        //important to ensure that any self-intersections close to BottomPt are
        //detected and removed before orientation is assigned.

        OutPt *opBot, *op2;
        if (ToFront)
        {
          opBot = outRec->pts;
          op2 = opBot->next; //op2 == right side
          if (opBot->pt.Y != op2->pt.Y && opBot->pt.Y != pt.Y &&
            ((opBot->pt.X - pt.X)/(opBot->pt.Y - pt.Y) <
            (opBot->pt.X - op2->pt.X)/(opBot->pt.Y - op2->pt.Y)))
               outRec->bottomFlag = opBot;
        } else
        {
          opBot = outRec->pts->prev;
          op2 = opBot->prev; //op2 == left side
          if (opBot->pt.Y != op2->pt.Y && opBot->pt.Y != pt.Y &&
            ((opBot->pt.X - pt.X)/(opBot->pt.Y - pt.Y) >
            (opBot->pt.X - op2->pt.X)/(opBot->pt.Y - op2->pt.Y)))
               outRec->bottomFlag = opBot;
        }
      }
    }

    OutPt* op2 = new OutPt;
    op2->pt = pt;
    op2->idx = outRec->idx;
    if (op2->pt.Y == outRec->bottomPt->pt.Y &&
      op2->pt.X < outRec->bottomPt->pt.X)
        outRec->bottomPt = op2;
    op2->next = op;
    op2->prev = op->prev;
    op2->prev->next = op2;
    op->prev = op2;
    if (ToFront) outRec->pts = op2;
  }
}